

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *ridx,int *rn,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  int *piVar12;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  cpp_dec_float<50U,_int,_void> local_298;
  int *local_260;
  int *local_258;
  pointer local_250;
  int *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  int *local_238;
  int *local_230;
  long local_228;
  cpp_dec_float<50U,_int,_void> local_220;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_298.fpclass = cpp_dec_float_finite;
  local_298.prec_elem = 10;
  local_298.data._M_elems[0] = 0;
  local_298.data._M_elems[1] = 0;
  local_298.data._M_elems[2] = 0;
  local_298.data._M_elems[3] = 0;
  local_298.data._M_elems[4] = 0;
  local_298.data._M_elems[5] = 0;
  local_298.data._M_elems._24_5_ = 0;
  local_298.data._M_elems[7]._1_3_ = 0;
  local_298.data._M_elems._32_5_ = 0;
  local_298.data._M_elems[9]._1_3_ = 0;
  local_298.exp = 0;
  local_298.neg = false;
  local_250 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_258 = (this->l).idx;
  local_248 = (this->l).row;
  uVar2 = (this->l).firstUpdate;
  uVar7 = 0;
  uVar10 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar10 = uVar7;
  }
  local_260 = (this->l).start;
  local_240 = eps;
  local_238 = ridx;
  local_230 = rn;
  for (; uVar7 != uVar10; uVar7 = uVar7 + 1) {
    iVar3 = local_248[uVar7];
    uVar5 = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 8);
    local_298.data._M_elems._32_5_ = SUB85(uVar5,0);
    local_298.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_298.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
    local_298.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 4;
    local_298.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar5 = *(undefined8 *)(puVar1 + 2);
    local_298.data._M_elems._24_5_ = SUB85(uVar5,0);
    local_298.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_298.exp = vec[iVar3].m_backend.exp;
    local_298.neg = vec[iVar3].m_backend.neg;
    local_1a8.m_backend.fpclass = vec[iVar3].m_backend.fpclass;
    local_1a8.m_backend.prec_elem = vec[iVar3].m_backend.prec_elem;
    local_298.prec_elem = local_1a8.m_backend.prec_elem;
    local_298.fpclass = local_1a8.m_backend.fpclass;
    local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
    local_1a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 4;
    local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_240->m_backend).data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_240->m_backend).data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_240->m_backend).data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_240->m_backend).data._M_elems + 6);
    local_e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_240->m_backend).data._M_elems + 8);
    local_e8.m_backend.exp = (local_240->m_backend).exp;
    local_e8.m_backend.neg = (local_240->m_backend).neg;
    local_e8.m_backend.fpclass = (local_240->m_backend).fpclass;
    local_e8.m_backend.prec_elem = (local_240->m_backend).prec_elem;
    local_1a8.m_backend.exp = local_298.exp;
    local_1a8.m_backend.neg = local_298.neg;
    bVar6 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1a8,&local_e8);
    if (bVar6) {
      iVar3 = local_260[uVar7];
      piVar11 = local_258 + iVar3;
      pcVar8 = &local_250[iVar3].m_backend;
      for (iVar9 = local_260[uVar7 + 1]; iVar3 < iVar9; iVar9 = iVar9 + -1) {
        iVar4 = *piVar11;
        piVar11 = piVar11 + 1;
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_68,&local_298,pcVar8);
        updateSolutionVectorLright
                  (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_68,iVar4,vec + iVar4,local_238,local_230);
        pcVar8 = pcVar8 + 1;
      }
    }
  }
  if ((this->l).updateType != 0) {
    local_228 = (long)(this->l).firstUnused;
    while (piVar11 = local_260, (long)uVar10 < local_228) {
      iVar3 = local_260[uVar10];
      piVar12 = local_258 + iVar3;
      pcVar8 = &local_250[iVar3].m_backend;
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_220);
      uVar7 = uVar10 + 1;
      for (iVar9 = piVar11[uVar10 + 1]; iVar3 < iVar9; iVar9 = iVar9 + -1) {
        iVar4 = *piVar12;
        piVar12 = piVar12 + 1;
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 10;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems._24_5_ = 0;
        local_a8.data._M_elems[7]._1_3_ = 0;
        local_a8.data._M_elems._32_5_ = 0;
        local_a8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_a8,&vec[iVar4].m_backend,pcVar8);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_220,&local_a8);
        pcVar8 = pcVar8 + 1;
      }
      iVar3 = local_248[uVar10];
      local_298.data._M_elems._32_5_ = local_220.data._M_elems._32_5_;
      local_298.data._M_elems[9]._1_3_ = local_220.data._M_elems[9]._1_3_;
      local_298.data._M_elems[4] = local_220.data._M_elems[4];
      local_298.data._M_elems[5] = local_220.data._M_elems[5];
      local_298.data._M_elems._24_5_ = local_220.data._M_elems._24_5_;
      local_298.data._M_elems[7]._1_3_ = local_220.data._M_elems[7]._1_3_;
      local_298.data._M_elems[0] = local_220.data._M_elems[0];
      local_298.data._M_elems[1] = local_220.data._M_elems[1];
      local_298.data._M_elems[2] = local_220.data._M_elems[2];
      local_298.data._M_elems[3] = local_220.data._M_elems[3];
      local_298.exp = local_220.exp;
      local_298.neg = local_220.neg;
      local_298.prec_elem = local_220.prec_elem;
      local_298.fpclass = local_220.fpclass;
      local_1e8.m_backend.data._M_elems[0] = local_220.data._M_elems[0];
      local_1e8.m_backend.data._M_elems[1] = local_220.data._M_elems[1];
      local_1e8.m_backend.data._M_elems[2] = local_220.data._M_elems[2];
      local_1e8.m_backend.data._M_elems[3] = local_220.data._M_elems[3];
      local_1e8.m_backend.data._M_elems[4] = local_220.data._M_elems[4];
      local_1e8.m_backend.data._M_elems[5] = local_220.data._M_elems[5];
      local_1e8.m_backend.data._M_elems[6] = local_220.data._M_elems[6];
      local_1e8.m_backend.data._M_elems[7] = local_220.data._M_elems[7];
      local_1e8.m_backend.data._M_elems[8] = local_220.data._M_elems[8];
      local_1e8.m_backend.data._M_elems[9] = local_220.data._M_elems[9];
      local_1e8.m_backend.exp = local_220.exp;
      local_1e8.m_backend.neg = local_220.neg;
      local_1e8.m_backend.fpclass = local_220.fpclass;
      local_1e8.m_backend.prec_elem = local_220.prec_elem;
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_240->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_240->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_240->m_backend).data._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_240->m_backend).data._M_elems + 6);
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_240->m_backend).data._M_elems + 8);
      local_128.m_backend.exp = (local_240->m_backend).exp;
      local_128.m_backend.neg = (local_240->m_backend).neg;
      local_128.m_backend.fpclass = (local_240->m_backend).fpclass;
      local_128.m_backend.prec_elem = (local_240->m_backend).prec_elem;
      bVar6 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1e8,&local_128);
      uVar10 = uVar7;
      if (bVar6) {
        local_168.m_backend.data._M_elems[9]._1_3_ = local_298.data._M_elems[9]._1_3_;
        local_168.m_backend.data._M_elems._32_5_ = local_298.data._M_elems._32_5_;
        local_168.m_backend.data._M_elems[7]._1_3_ = local_298.data._M_elems[7]._1_3_;
        local_168.m_backend.data._M_elems._24_5_ = local_298.data._M_elems._24_5_;
        local_168.m_backend.data._M_elems[4] = local_298.data._M_elems[4];
        local_168.m_backend.data._M_elems[5] = local_298.data._M_elems[5];
        local_168.m_backend.data._M_elems[0] = local_298.data._M_elems[0];
        local_168.m_backend.data._M_elems[1] = local_298.data._M_elems[1];
        local_168.m_backend.data._M_elems[2] = local_298.data._M_elems[2];
        local_168.m_backend.data._M_elems[3] = local_298.data._M_elems[3];
        local_168.m_backend.exp = local_298.exp;
        local_168.m_backend.neg = local_298.neg;
        local_168.m_backend.fpclass = local_298.fpclass;
        local_168.m_backend.prec_elem = local_298.prec_elem;
        updateSolutionVectorLright(this,&local_168,iVar3,vec + iVar3,local_238,local_230);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright(R* vec, int* ridx, int& rn, R eps)
{
   int i, j, k, n;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      x = vec[lrow[i]];

      // check whether there is a corresponding value in the rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // apply \f$- x * L_{k,i}\f$ to all corresponding values in rhs/solution VectorBase<R>
         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp += vec[*idx++] * (*val++);
         }

         j = lrow[i];
         x = R(tmp);

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);
      }
   }
}